

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.c
# Opt level: O2

char * flatcc_json_parser_set_error(flatcc_json_parser_t *ctx,char *loc,char *end,int err)

{
  if (ctx->error != 0) {
    return end;
  }
  ctx->error = err;
  ctx->pos = ((int)loc - *(int *)&ctx->line_start) + 1;
  ctx->error_loc = loc;
  return end;
}

Assistant:

const char *flatcc_json_parser_set_error(flatcc_json_parser_t *ctx, const char *loc, const char *end, int err)
{
    if (!ctx->error) {
        ctx->error = err;
        ctx->pos = (int)(loc - ctx->line_start + 1);
        ctx->error_loc = loc;
    }
    return end;
}